

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::CompilerMSL::build_constant_uint_array_pointer(CompilerMSL *this)

{
  ID id;
  SPIRType *pSVar1;
  uint32_t type_ptr_ptr_id;
  StorageClass local_2c4;
  SPIRType uint_type_pointer;
  SPIRType uint_type_pointer2;
  
  id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  type_ptr_ptr_id = id.id + 1;
  pSVar1 = get_uint_type(this);
  SPIRType::SPIRType(&uint_type_pointer,pSVar1);
  uint_type_pointer.pointer = true;
  uint_type_pointer.pointer_depth = uint_type_pointer.pointer_depth + 1;
  uint_type_pointer.parent_type.id = get_uint_type_id(this);
  uint_type_pointer.storage = StorageClassUniform;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,id.id,&uint_type_pointer);
  Compiler::set_decoration((Compiler *)this,id,DecorationArrayStride,4);
  SPIRType::SPIRType(&uint_type_pointer2,&uint_type_pointer);
  uint_type_pointer2.pointer_depth = uint_type_pointer2.pointer_depth + 1;
  uint_type_pointer2.parent_type.id = id.id;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,id.id + 1,&uint_type_pointer2);
  local_2c4 = StorageClassUniformConstant;
  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
            ((Compiler *)this,id.id + 2,&type_ptr_ptr_id,&local_2c4);
  SPIRType::~SPIRType(&uint_type_pointer2);
  SPIRType::~SPIRType(&uint_type_pointer);
  return id.id + 2;
}

Assistant:

uint32_t CompilerMSL::build_constant_uint_array_pointer()
{
	uint32_t offset = ir.increase_bound_by(3);
	uint32_t type_ptr_id = offset;
	uint32_t type_ptr_ptr_id = offset + 1;
	uint32_t var_id = offset + 2;

	// Create a buffer to hold extra data, including the swizzle constants.
	SPIRType uint_type_pointer = get_uint_type();
	uint_type_pointer.pointer = true;
	uint_type_pointer.pointer_depth++;
	uint_type_pointer.parent_type = get_uint_type_id();
	uint_type_pointer.storage = StorageClassUniform;
	set<SPIRType>(type_ptr_id, uint_type_pointer);
	set_decoration(type_ptr_id, DecorationArrayStride, 4);

	SPIRType uint_type_pointer2 = uint_type_pointer;
	uint_type_pointer2.pointer_depth++;
	uint_type_pointer2.parent_type = type_ptr_id;
	set<SPIRType>(type_ptr_ptr_id, uint_type_pointer2);

	set<SPIRVariable>(var_id, type_ptr_ptr_id, StorageClassUniformConstant);
	return var_id;
}